

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGate2.hpp
# Opt level: O0

bool __thiscall
qclab::qgates::PointerGate2<double>::equals(PointerGate2<double> *this,QObject<double> *other)

{
  QObject<double> *pQVar1;
  QObject<double> *other_00;
  PointerGate2<double> *local_40;
  G *p;
  QObject<double> *other_local;
  PointerGate2<double> *this_local;
  
  if (other == (QObject<double> *)0x0) {
    local_40 = (PointerGate2<double> *)0x0;
  }
  else {
    local_40 = (PointerGate2<double> *)__dynamic_cast(other,&QObject<double>::typeinfo,&typeinfo,0);
  }
  if (local_40 == (PointerGate2<double> *)0x0) {
    pQVar1 = &ptr(this)->super_QObject<double>;
    this_local._7_1_ = QObject<double>::operator==(other,pQVar1);
  }
  else {
    pQVar1 = &ptr(local_40)->super_QObject<double>;
    other_00 = &ptr(this)->super_QObject<double>;
    this_local._7_1_ = QObject<double>::operator==(pQVar1,other_00);
  }
  return this_local._7_1_;
}

Assistant:

inline bool equals( const QObject< T >& other ) const override {
          using G = PointerGate2< T > ;
          if ( const G* p = dynamic_cast< const G* >( &other ) ) {
            return *p->ptr() == *this->ptr() ;
          }
          return other == *this->ptr() ;
        }